

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

GLuint a__GLCreateShader(int type,char **source)

{
  char **ppcVar1;
  GLuint GVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  GLint status;
  int local_1c;
  
  GVar2 = glCreateShader(CONCAT44(in_register_0000003c,type));
  lVar3 = 0;
  do {
    ppcVar1 = source + lVar3;
    lVar3 = lVar3 + 1;
  } while (*ppcVar1 != (char *)0x0);
  glShaderSource(GVar2,(int)lVar3 + -1,source,0);
  glCompileShader(GVar2);
  glGetShaderiv(GVar2,0x8b81,&local_1c);
  if (local_1c != 1) {
    glGetShaderInfoLog(GVar2,0x400,0,a_gl_error);
    glDeleteShader(GVar2);
    GVar2 = 0;
  }
  return GVar2;
}

Assistant:

static GLuint a__GLCreateShader(int type, const char *const *source) {
	int n;
	GLuint shader = glCreateShader(type);

	for (n = 0; source[n] != 0; ++n)
		;

	AGL__CALL(glShaderSource(shader, n, (const GLchar **)source, 0));
	AGL__CALL(glCompileShader(shader));

	{
		GLint status;
		AGL__CALL(glGetShaderiv(shader, GL_COMPILE_STATUS, &status));
		if (status != GL_TRUE) {
			AGL__CALL(glGetShaderInfoLog(shader, sizeof(a_gl_error), 0, a_gl_error));
			AGL__CALL(glDeleteShader(shader));
			shader = 0;
		}
	}

	return shader;
}